

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader15.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::LibraryEffectsLoader15::data__wrap_t____fx_sampler_wrap_enum
          (LibraryEffectsLoader15 *this)

{
  ENUM__fx_sampler_wrap_enum in_ESI;
  
  data__wrap_t____fx_sampler_wrap_enum
            ((LibraryEffectsLoader15 *)&this[-1].super_LibraryImagesLoader15.mLoader,in_ESI);
  return;
}

Assistant:

bool LibraryEffectsLoader15::data__wrap_t____fx_sampler_wrap_enum( const COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum value )
{
SaxVirtualFunctionTest15(data__wrap_t____fx_sampler_wrap_enum(value));
COLLADASaxFWL::ENUM__fx_sampler_wrap_common newValue;
switch (value) {
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__WRAP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__WRAP; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__CLAMP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__CLAMP; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__BORDER: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__BORDER; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__MIRROR: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__MIRROR_ONCE: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR_ONCE; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__COUNT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__COUNT; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__NOT_PRESENT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NOT_PRESENT; break;
}
return mLoader->data__wrap_t____fx_sampler_wrap_common(newValue);
}